

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

rnnvalue * copyvalue(rnnvalue *val,char *file)

{
  rnnvalue *prVar1;
  char *pcVar2;
  
  prVar1 = (rnnvalue *)calloc(0x68,1);
  pcVar2 = strdup(val->name);
  prVar1->name = pcVar2;
  prVar1->valvalid = val->valvalid;
  prVar1->value = val->value;
  copyvarinfo(&prVar1->varinfo,&val->varinfo);
  prVar1->file = file;
  return prVar1;
}

Assistant:

static struct rnnvalue *copyvalue (struct rnnvalue *val, char *file) {
	struct rnnvalue *res = calloc (sizeof *res, 1);
	res->name = strdup(val->name);
	res->valvalid = val->valvalid;
	res->value = val->value;
	copyvarinfo(&res->varinfo, &val->varinfo);
	res->file = file;
	return res;
}